

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

void __thiscall Tracker::start(Tracker *this)

{
  rep rVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  local_28;
  duration<long,_std::ratio<1L,_1000000L>_> local_20;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point start;
  Tracker *this_local;
  
  start.__d.__r = (duration)(duration)this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_StatTrack>_>_>
  ::clear(&this->m_data);
  local_18.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_28.__d.__r =
       (duration)
       std::chrono::
       time_point_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (&local_18);
  local_20.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
                      ::time_since_epoch(&local_28);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_20);
  this->m_trackerStart = (double)rVar1 * 0.001;
  this->m_running = true;
  return;
}

Assistant:

void Tracker::start() {
    m_data.clear();

    auto start = std::chrono::high_resolution_clock::now();
    m_trackerStart = std::chrono::time_point_cast<std::chrono::microseconds>(start).time_since_epoch().count() * 0.001;
    m_running = true;
}